

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

int lj_tab_next(lua_State *L,GCtab *t,TValue *key)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Node *pNVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  TValue *pTVar9;
  
  uVar2 = (key->field_2).it;
  if (uVar2 < 0xfffeffff) {
    dVar1 = key->n;
    uVar3 = (uint)dVar1;
    if (uVar3 < t->asize) {
      if ((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1)))
      goto LAB_0010ad2e;
    }
  }
  else if (uVar2 == 0xffffffff) {
    uVar3 = 0xffffffff;
    goto LAB_0010ad2e;
  }
  pNVar5 = hashkey(t,key);
  do {
    iVar4 = lj_obj_equal(&pNVar5->key,key);
    if (iVar4 != 0) {
      uVar3 = (int)((long)((long)pNVar5 - (ulong)(t->node).ptr32) / 0x18) + t->asize;
      goto LAB_0010ad2e;
    }
    pNVar5 = (Node *)(ulong)(pNVar5->next).ptr32;
  } while (pNVar5 != (Node *)0x0);
  if (uVar2 != 0xfffe7fff) {
    lj_err_msg(L,LJ_ERR_NEXTIDX);
  }
  uVar3 = (key->u32).lo - 1;
LAB_0010ad2e:
  uVar2 = t->asize;
  uVar6 = uVar3 + 1;
  do {
    uVar3 = uVar3 + 1;
    if (uVar2 <= uVar3) {
      uVar3 = uVar6 - uVar2;
      if (uVar6 < uVar2) {
        uVar3 = 0;
      }
      do {
        uVar7 = (ulong)uVar3;
        if (t->hmask < uVar3) {
          return 0;
        }
        uVar8 = (ulong)(t->node).ptr32;
        uVar3 = uVar3 + 1;
      } while (*(int *)(uVar8 + 4 + uVar7 * 0x18) == -1);
      pTVar9 = (TValue *)(uVar8 + uVar7 * 0x18);
      *key = pTVar9[1];
      goto LAB_0010ad86;
    }
  } while (*(int *)((ulong)(t->array).ptr32 + 4 + (ulong)uVar3 * 8) == -1);
  key->n = (double)(int)uVar3;
  pTVar9 = (TValue *)((ulong)(t->array).ptr32 + (ulong)uVar3 * 8);
LAB_0010ad86:
  key[1] = *pTVar9;
  return 1;
}

Assistant:

int lj_tab_next(lua_State *L, GCtab *t, TValue *key)
{
  uint32_t i = keyindex(L, t, key);  /* Find predecessor key index. */
  for (i++; i < t->asize; i++)  /* First traverse the array keys. */
    if (!tvisnil(arrayslot(t, i))) {
      setintV(key, i);
      copyTV(L, key+1, arrayslot(t, i));
      return 1;
    }
  for (i -= t->asize; i <= t->hmask; i++) {  /* Then traverse the hash keys. */
    Node *n = &noderef(t->node)[i];
    if (!tvisnil(&n->val)) {
      copyTV(L, key, &n->key);
      copyTV(L, key+1, &n->val);
      return 1;
    }
  }
  return 0;  /* End of traversal. */
}